

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O0

FT_Error t1_set_mm_blend(T1_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  PS_Blend pPVar1;
  bool bVar2;
  FT_Int32 FVar3;
  long local_50;
  FT_Fixed factor;
  FT_Fixed result;
  uint local_38;
  uint uStack_34;
  FT_Bool have_diff;
  FT_UInt m;
  FT_UInt n;
  PS_Blend blend;
  FT_Fixed *coords_local;
  FT_UInt num_coords_local;
  T1_Face face_local;
  
  pPVar1 = face->blend;
  bVar2 = false;
  if (pPVar1 == (PS_Blend)0x0) {
    face_local._4_4_ = 6;
  }
  else {
    coords_local._4_4_ = num_coords;
    if (pPVar1->num_axis < num_coords) {
      coords_local._4_4_ = pPVar1->num_axis;
    }
    for (uStack_34 = 0; uStack_34 < pPVar1->num_designs; uStack_34 = uStack_34 + 1) {
      factor = 0x10000;
      for (local_38 = 0; local_38 < pPVar1->num_axis; local_38 = local_38 + 1) {
        if (local_38 < coords_local._4_4_) {
          local_50 = coords[local_38];
          if ((uStack_34 & 1 << ((byte)local_38 & 0x1f)) == 0) {
            local_50 = 0x10000 - local_50;
          }
          if (local_50 < 1) {
            factor = 0;
            break;
          }
          if (local_50 < 0x10000) {
            FVar3 = FT_MulFix_x86_64((FT_Int32)factor,(FT_Int32)local_50);
            factor = (FT_Fixed)FVar3;
          }
        }
        else {
          factor = factor >> 1;
        }
      }
      if (pPVar1->weight_vector[uStack_34] != factor) {
        pPVar1->weight_vector[uStack_34] = factor;
        bVar2 = true;
      }
    }
    face_local._4_4_ = -1;
    if (bVar2) {
      face_local._4_4_ = 0;
    }
  }
  return face_local._4_4_;
}

Assistant:

static FT_Error
  t1_set_mm_blend( T1_Face    face,
                   FT_UInt    num_coords,
                   FT_Fixed*  coords )
  {
    PS_Blend  blend = face->blend;
    FT_UInt   n, m;

    FT_Bool  have_diff = 0;


    if ( !blend )
      return FT_THROW( Invalid_Argument );

    if ( num_coords > blend->num_axis )
      num_coords = blend->num_axis;

    /* recompute the weight vector from the blend coordinates */
    for ( n = 0; n < blend->num_designs; n++ )
    {
      FT_Fixed  result = 0x10000L;  /* 1.0 fixed */
      FT_Fixed  factor;


      for ( m = 0; m < blend->num_axis; m++ )
      {
        /* use a default value if we don't have a coordinate */
        if ( m >= num_coords )
        {
          result >>= 1;
          continue;
        }

        /* get current blend axis position */
        factor = coords[m];
        if ( ( n & ( 1 << m ) ) == 0 )
          factor = 0x10000L - factor;

        if ( factor <= 0 )
        {
          result = 0;
          break;
        }
        else if ( factor >= 0x10000L )
          continue;

        result = FT_MulFix( result, factor );
      }

      if ( blend->weight_vector[n] != result )
      {
        blend->weight_vector[n] = result;
        have_diff               = 1;
      }
    }

    /* return value -1 indicates `no change' */
    return have_diff ? FT_Err_Ok : -1;
  }